

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O2

_Bool mon_select(monster_race *race)

{
  _Bool _Var1;
  uint32_t uVar2;
  
  if ((base_d_char == L'\0') || (base_d_char == race->base->d_char)) {
    if (select_current_level < L'(') {
      _Var1 = flag_has_dbg(race->flags,0xb,0x3e,"race->flags","RF_UNDEAD");
      if ((_Var1) &&
         (_Var1 = flag_has_dbg(race->flags,0xb,0x28,"race->flags","RF_INVISIBLE"), _Var1)) {
        return false;
      }
    }
    _Var1 = flag_has_dbg(race->flags,0xb,1,"race->flags","RF_UNIQUE");
    if ((!_Var1) || ((allow_unique == true && (uVar2 = Rand_div(5), uVar2 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool mon_select(struct monster_race *race)
{
	/* Require that the monster symbol be correct. */
	if (base_d_char != 0 && base_d_char != race->base->d_char) {
		return false;
	}

	/* No invisible undead until deep. */
	if (select_current_level < 40 && rf_has(race->flags, RF_UNDEAD)
			&& rf_has(race->flags, RF_INVISIBLE))
		return (false);

	/* Usually decline unique monsters. */
	if (rf_has(race->flags, RF_UNIQUE)) {
		if (!allow_unique)
			return (false);
		else if (randint0(5) != 0)
			return (false);
	}

	/* Okay */
	return (true);
}